

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DebugManager.cpp
# Opt level: O0

void __thiscall Js::DebugManager::UnsetCurrentInterpreterLocation(DebugManager *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Recycler *this_00;
  ArenaAllocator *pAVar4;
  ArenaData *local_20;
  DebugManager *this_local;
  
  if (this->pCurrentInterpreterLocation == (InterpreterHaltState *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DebugManager.cpp"
                                ,0x65,"(pCurrentInterpreterLocation)","pCurrentInterpreterLocation")
    ;
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if (this->pCurrentInterpreterLocation != (InterpreterHaltState *)0x0) {
    if (this->pCurrentInterpreterLocation->referencedDiagnosticArena !=
        (ReferencedArenaAdapter *)0x0) {
      this_00 = ThreadContext::GetRecycler(this->pThreadContext);
      pAVar4 = Memory::ReferencedArenaAdapter::Arena
                         (this->pCurrentInterpreterLocation->referencedDiagnosticArena);
      local_20 = (ArenaData *)0x0;
      if (pAVar4 != (ArenaAllocator *)0x0) {
        local_20 = &(pAVar4->
                    super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>).
                    super_ArenaData;
      }
      Memory::Recycler::UnregisterExternalGuestArena(this_00,local_20);
      Memory::ReferencedArenaAdapter::DeleteArena
                (this->pCurrentInterpreterLocation->referencedDiagnosticArena);
      Memory::RefCounted::Release
                (&this->pCurrentInterpreterLocation->referencedDiagnosticArena->super_RefCounted);
    }
    this->pCurrentInterpreterLocation = (InterpreterHaltState *)0x0;
  }
  return;
}

Assistant:

void DebugManager::UnsetCurrentInterpreterLocation()
    {
        Assert(pCurrentInterpreterLocation);

        if (pCurrentInterpreterLocation)
        {
            // pCurrentInterpreterLocation->referencedDiagnosticArena could be null if we ran out of memory during SetCurrentInterpreterLocation
            if (pCurrentInterpreterLocation->referencedDiagnosticArena)
            {
                pThreadContext->GetRecycler()->UnregisterExternalGuestArena(pCurrentInterpreterLocation->referencedDiagnosticArena->Arena());
                pCurrentInterpreterLocation->referencedDiagnosticArena->DeleteArena();
                pCurrentInterpreterLocation->referencedDiagnosticArena->Release();
            }

            pCurrentInterpreterLocation = nullptr;
        }
    }